

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::ItemSimilarityRecommender::InternalSwap
          (ItemSimilarityRecommender *this,ItemSimilarityRecommender *other)

{
  int iVar1;
  string *psVar2;
  StringVector *pSVar3;
  Int64Vector *pIVar4;
  
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->itemitemsimilarities_).super_RepeatedPtrFieldBase,
             &(other->itemitemsimilarities_).super_RepeatedPtrFieldBase);
  psVar2 = (this->iteminputfeaturename_).ptr_;
  (this->iteminputfeaturename_).ptr_ = (other->iteminputfeaturename_).ptr_;
  (other->iteminputfeaturename_).ptr_ = psVar2;
  psVar2 = (this->numrecommendationsinputfeaturename_).ptr_;
  (this->numrecommendationsinputfeaturename_).ptr_ =
       (other->numrecommendationsinputfeaturename_).ptr_;
  (other->numrecommendationsinputfeaturename_).ptr_ = psVar2;
  psVar2 = (this->itemrestrictioninputfeaturename_).ptr_;
  (this->itemrestrictioninputfeaturename_).ptr_ = (other->itemrestrictioninputfeaturename_).ptr_;
  (other->itemrestrictioninputfeaturename_).ptr_ = psVar2;
  psVar2 = (this->itemexclusioninputfeaturename_).ptr_;
  (this->itemexclusioninputfeaturename_).ptr_ = (other->itemexclusioninputfeaturename_).ptr_;
  (other->itemexclusioninputfeaturename_).ptr_ = psVar2;
  psVar2 = (this->recommendeditemlistoutputfeaturename_).ptr_;
  (this->recommendeditemlistoutputfeaturename_).ptr_ =
       (other->recommendeditemlistoutputfeaturename_).ptr_;
  (other->recommendeditemlistoutputfeaturename_).ptr_ = psVar2;
  psVar2 = (this->recommendeditemscoreoutputfeaturename_).ptr_;
  (this->recommendeditemscoreoutputfeaturename_).ptr_ =
       (other->recommendeditemscoreoutputfeaturename_).ptr_;
  (other->recommendeditemscoreoutputfeaturename_).ptr_ = psVar2;
  pSVar3 = this->itemstringids_;
  this->itemstringids_ = other->itemstringids_;
  other->itemstringids_ = pSVar3;
  pIVar4 = this->itemint64ids_;
  this->itemint64ids_ = other->itemint64ids_;
  other->itemint64ids_ = pIVar4;
  iVar1 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar1;
  return;
}

Assistant:

void ItemSimilarityRecommender::InternalSwap(ItemSimilarityRecommender* other) {
  itemitemsimilarities_.InternalSwap(&other->itemitemsimilarities_);
  iteminputfeaturename_.Swap(&other->iteminputfeaturename_);
  numrecommendationsinputfeaturename_.Swap(&other->numrecommendationsinputfeaturename_);
  itemrestrictioninputfeaturename_.Swap(&other->itemrestrictioninputfeaturename_);
  itemexclusioninputfeaturename_.Swap(&other->itemexclusioninputfeaturename_);
  recommendeditemlistoutputfeaturename_.Swap(&other->recommendeditemlistoutputfeaturename_);
  recommendeditemscoreoutputfeaturename_.Swap(&other->recommendeditemscoreoutputfeaturename_);
  std::swap(itemstringids_, other->itemstringids_);
  std::swap(itemint64ids_, other->itemint64ids_);
  std::swap(_cached_size_, other->_cached_size_);
}